

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

int __thiscall Instructions::jumpInstruction(Instructions *this,string *name,int sign,int offset)

{
  ushort uVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)name);
  std::operator<<(poVar2," ");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           (string *)
                           ((this->names).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                           (this->code).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[(long)offset + 1]));
  std::operator<<(poVar2," ");
  uVar1 = *(ushort *)
           ((this->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + (long)offset + 2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,offset);
  poVar2 = std::operator<<(poVar2," -> ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8) * sign + offset + 4);
  std::endl<char,std::char_traits<char>>(poVar2);
  return offset + 4;
}

Assistant:

int Instructions::jumpInstruction(const std::string& name, int sign, int offset)
{
    std::cout << name << " ";
    auto tape = code[static_cast<int>(offset + 1)];
    std::cout << names[tape] << " ";
    uint16_t jump = (uint16_t)(code[static_cast<int>(offset + 2)] << 8);
    jump |= code[static_cast<int>(offset + 3)];
    std::cout << offset << " -> " << offset + 4 + sign * jump << std::endl;
    return offset + 4;
}